

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool run_bitset_container_intersect(run_container_t *src_1,bitset_container_t *src_2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint64_t *puVar4;
  _Bool _Var5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  _Var5 = run_container_is_full(src_1);
  if (_Var5) {
    _Var5 = bitset_container_empty(src_2);
    bVar6 = !_Var5;
  }
  else {
    uVar3 = src_1->n_runs;
    uVar9 = 0;
    uVar10 = 0;
    if (0 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      uVar1 = src_1->runs[uVar9].value;
      uVar2 = src_1->runs[uVar9].length;
      puVar4 = src_2->words;
      uVar7 = (uint)uVar2 + (uint)uVar1;
      uVar11 = (ulong)(uint)(uVar1 >> 6);
      uVar8 = uVar7 >> 6;
      if (uVar1 >> 6 == uVar8) {
        if (((0xffffffffffffffffU >> (0x3fU - (char)uVar2 & 0x3f)) << ((byte)uVar1 & 0x3f) &
            puVar4[uVar11]) != 0) {
          return true;
        }
      }
      else {
        if (puVar4[uVar11] >> ((byte)uVar1 & 0x3f) != 0) {
          return true;
        }
        while (uVar11 = uVar11 + 1, uVar11 < uVar8) {
          if (puVar4[uVar11] != 0) {
            return true;
          }
        }
        if (puVar4[uVar8] << (~(byte)uVar7 & 0x3f) != 0) {
          return true;
        }
      }
    }
    bVar6 = (long)uVar9 < (long)(int)uVar3;
  }
  return bVar6;
}

Assistant:

bool run_bitset_container_intersect(const run_container_t *src_1,
                                       const bitset_container_t *src_2) {
	   if( run_container_is_full(src_1) ) {
		   return !bitset_container_empty(src_2);
	   }
       for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
           rle16_t rle = src_1->runs[rlepos];
           if(!bitset_lenrange_empty(src_2->words, rle.value,rle.length)) return true;
       }
       return false;
}